

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O1

future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
mxx::comm::irecv_str<char,std::char_traits<char>,std::allocator<char>>
          (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,comm *this,size_t size,int src,int tag)

{
  pointer pcVar1;
  MPI_Comm poVar2;
  pointer ppoVar3;
  pointer ppoVar4;
  pointer ppoVar5;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  undefined8 uVar7;
  future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> f
  ;
  datatype dt;
  uint local_c0 [2];
  undefined1 local_b8 [24];
  pointer local_a0;
  pointer ppoStack_98;
  pointer local_90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_88;
  datatype local_80;
  undefined1 local_68 [16];
  undefined **local_58;
  pointer local_50;
  pointer ppoStack_48;
  pointer local_40;
  undefined8 local_38;
  
  if ((src < 0) || (this->m_size <= src)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_c0);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_c0[0],
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/comm_fwd.hpp"
           ,0x26e,"irecv_str","0 <= src && src < this->size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_c0[0] = CONCAT31(local_c0[0]._1_3_,1);
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::future
            ((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b8);
  std::__cxx11::string::resize((ulong)_Stack_88._M_head_impl,(char)size);
  if (size < 0x7fffffff) {
    local_68._0_8_ = &PTR__datatype_0013a328;
    local_68._8_8_ = &ompi_mpi_char;
    local_58 = (undefined **)CONCAT71(local_58._1_7_,true);
    pcVar1 = ((_Stack_88._M_head_impl)->_M_dataplus)._M_p;
    poVar2 = this->mpi_comm;
    local_80._vptr_datatype = (_func_int **)0x0;
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
              ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_a0,
               (ompi_request_t **)&local_80);
    MPI_Irecv(pcVar1,size & 0xffffffff,&ompi_mpi_char,src,tag,poVar2,ppoStack_98 + -1);
  }
  else {
    local_80._vptr_datatype = (_func_int **)&PTR__datatype_0013a328;
    local_80.mpitype = (MPI_Datatype)&ompi_mpi_char;
    local_80.builtin = true;
    datatype::contiguous((datatype *)local_68,&local_80,size);
    datatype::~datatype(&local_80);
    uVar7 = local_68._8_8_;
    pcVar1 = ((_Stack_88._M_head_impl)->_M_dataplus)._M_p;
    poVar2 = this->mpi_comm;
    local_80._vptr_datatype = (_func_int **)0x0;
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
              ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_a0,
               (ompi_request_t **)&local_80);
    MPI_Irecv(pcVar1,1,uVar7,src,tag,poVar2,ppoStack_98 + -1);
  }
  datatype::~datatype((datatype *)local_68);
  _Var6._M_head_impl = _Stack_88._M_head_impl;
  ppoVar5 = local_90;
  ppoVar4 = ppoStack_98;
  ppoVar3 = local_a0;
  local_c0[0] = local_c0[0] & 0xffffff00;
  local_68._8_2_ = local_b8._8_2_;
  local_58 = &PTR__requests_0013a228;
  local_a0 = (pointer)0x0;
  ppoStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  _Stack_88._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_future_base = (_func_int **)&PTR__future_base_0013a2a0;
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_valid = (bool)local_b8[8];
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_ever_valid = (bool)local_b8[9];
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_req._vptr_requests = (_func_int **)&PTR__requests_0013a228;
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_start = ppoVar3;
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_finish = ppoVar4;
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_req.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = ppoVar5;
  local_40 = (pointer)0x0;
  local_50 = (pointer)0x0;
  ppoStack_48 = (pointer)0x0;
  (__return_storage_ptr__->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_future_base = (_func_int **)&PTR__future_0013a258;
  (__return_storage_ptr__->m_data)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = _Var6._M_head_impl;
  local_38 = 0;
  local_68._0_8_ = &PTR__future_0013a258;
  impl::
  future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future_base((future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68);
  local_b8._0_8_ = &PTR__future_0013a258;
  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )_Stack_88._M_head_impl !=
      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_88,_Stack_88._M_head_impl);
  }
  _Stack_88._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  impl::
  future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future_base((future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<std::basic_string<CharT, Traits, Alloc> > comm::irecv_str(size_t size, int src, int tag) const {
    MXX_ASSERT(0 <= src && src < this->size());
    mxx::future_builder<std::basic_string<CharT, Traits, Alloc> > f;
    f.data()->resize(size);
    if (size < mxx::max_int) {
        mxx::datatype dt = mxx::get_datatype<CharT>();
        MPI_Irecv(&(f.data()->front()), size, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    } else {
        mxx::datatype dt = mxx::get_datatype<CharT>().contiguous(size);
        MPI_Irecv(&(f.data()->front()), 1, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    }
    return std::move(f.get_future());
}